

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepImageLevel::insertChannel
          (DeepImageLevel *this,string *name,PixelType type,int xSampling,int ySampling,bool pLinear
          )

{
  iterator iVar1;
  TypedDeepImageChannel<Imath_3_2::half> *this_00;
  mapped_type *ppDVar2;
  ostream *poVar3;
  ArgExc *this_01;
  stringstream _iex_throw_s;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  if (ySampling != 1 && xSampling != 1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(asStack_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Cannot create deep image channel ",0x21);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," with x sampling rate ",0x16);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,xSampling);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," and and y sampling rate ",0x19);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ySampling);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,". X and y sampling rates for deep channels must be 1.",0x35);
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this_01,asStack_1b8);
    __cxa_throw(this_01,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
          ::find(&(this->_channels)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_channels)._M_t._M_impl.super__Rb_tree_header) {
    ImageLevel::throwChannelExists(&this->super_ImageLevel,name);
  }
  if (type == UINT) {
    this_00 = (TypedDeepImageChannel<Imath_3_2::half> *)operator_new(0x48);
    TypedDeepImageChannel<unsigned_int>::TypedDeepImageChannel
              ((TypedDeepImageChannel<unsigned_int> *)this_00,this,pLinear);
  }
  else if (type == FLOAT) {
    this_00 = (TypedDeepImageChannel<Imath_3_2::half> *)operator_new(0x48);
    TypedDeepImageChannel<float>::TypedDeepImageChannel
              ((TypedDeepImageChannel<float> *)this_00,this,pLinear);
  }
  else {
    if (type != HALF) {
      return;
    }
    this_00 = (TypedDeepImageChannel<Imath_3_2::half> *)operator_new(0x48);
    TypedDeepImageChannel<Imath_3_2::half>::TypedDeepImageChannel(this_00,this,pLinear);
  }
  ppDVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
            ::operator[](&this->_channels,name);
  *ppDVar2 = &this_00->super_DeepImageChannel;
  return;
}

Assistant:

void
DeepImageLevel::insertChannel (
    const string& name,
    PixelType     type,
    int           xSampling,
    int           ySampling,
    bool          pLinear)
{
    if (xSampling != 1 && ySampling != 1)
    {
        THROW (
            ArgExc,
            "Cannot create deep image channel "
                << name
                << " "
                   "with x sampling rate "
                << xSampling
                << " and "
                   "and y sampling rate "
                << ySampling
                << ". X and y "
                   "sampling rates for deep channels must be 1.");
    }

    if (_channels.find (name) != _channels.end ()) throwChannelExists (name);

    switch (type)
    {
        case HALF:
            _channels[name] = new DeepHalfChannel (*this, pLinear);
            break;

        case FLOAT:
            _channels[name] = new DeepFloatChannel (*this, pLinear);
            break;

        case UINT:
            _channels[name] = new DeepUIntChannel (*this, pLinear);
            break;

        default: assert (false);
    }
}